

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysAllocService.cpp
# Opt level: O0

void * anon_unknown.dwarf_47f904::cali_malloc_wrapper(size_t size)

{
  int iVar1;
  bool bVar2;
  code *pcVar3;
  void *ptr;
  int *piVar4;
  ChannelBody *chB;
  undefined1 local_50 [8];
  Caliper c;
  ChannelList *p;
  int saved_errno;
  void *ret;
  _func_void_ptr_size_t *orig_malloc;
  size_t size_local;
  
  orig_malloc = (_func_void_ptr_size_t *)size;
  pcVar3 = (code *)gotcha_get_wrappee((anonymous_namespace)::orig_malloc_handle);
  ptr = (void *)(*pcVar3)(orig_malloc);
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  c.m_is_signal = (anonymous_namespace)::sysalloc_channels._0_1_;
  c._25_7_ = (anonymous_namespace)::sysalloc_channels._1_7_;
  for (; c._24_8_ != 0; c._24_8_ = *(undefined8 *)(c._24_8_ + 0x10)) {
    cali::Caliper::sigsafe_instance();
    bVar2 = cali::Caliper::operator_cast_to_bool((Caliper *)local_50);
    if ((bVar2) && (bVar2 = cali::Channel::is_active((Channel *)c._24_8_), bVar2)) {
      chB = cali::Channel::body((Channel *)c._24_8_);
      cali::Caliper::memory_region_begin
                ((Caliper *)local_50,chB,ptr,"malloc",1,1,(size_t *)&orig_malloc,0,(Attribute *)0x0,
                 (Variant *)0x0);
    }
    cali::Caliper::~Caliper((Caliper *)local_50);
  }
  piVar4 = __errno_location();
  *piVar4 = iVar1;
  return ptr;
}

Assistant:

void* cali_malloc_wrapper(size_t size)
{
    decltype(&std::malloc) orig_malloc =
        reinterpret_cast<decltype(&std::malloc)>(gotcha_get_wrappee(orig_malloc_handle));

    void* ret = (*orig_malloc)(size);

    int saved_errno = errno;

    for (ChannelList* p = sysalloc_channels; p; p = p->next) {
        Caliper c = Caliper::sigsafe_instance(); // prevent reentry

        if (c && p->channel.is_active())
            c.memory_region_begin(p->channel.body(), ret, "malloc", 1, 1, &size);
    }

    errno = saved_errno;

    return ret;
}